

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteSectionHeader
          (BinaryWriter *this,char *desc,BinarySection section_code)

{
  size_t sVar1;
  Stream *this_00;
  uint8_t data [5];
  undefined4 local_20;
  undefined1 local_1c;
  
  if (this->last_section_leb_size_guess_ == 0) {
    this_00 = this->stream_;
    if (this_00->log_stream_ != (Stream *)0x0) {
      Stream::Writef(this_00->log_stream_,"; %s\n",desc);
      this_00 = this->stream_;
    }
    Stream::WriteU8(this_00,section_code,"section code",No);
    this->last_section_type_ = section_code;
    this->last_section_leb_size_guess_ = 1;
    local_1c = 0;
    local_20 = 0;
    sVar1 = this->stream_->offset_;
    Stream::WriteData(this->stream_,&local_20,(ulong)(this->options_->canonicalize_lebs ^ 1) * 4 + 1
                      ,"section size (guess)",No);
    this->last_section_offset_ = sVar1;
    this->last_section_payload_offset_ = this->stream_->offset_;
    return;
  }
  __assert_fail("last_section_leb_size_guess_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer.cc"
                ,0xfc,
                "void wabt::(anonymous namespace)::BinaryWriter::WriteSectionHeader(const char *, BinarySection)"
               );
}

Assistant:

void BinaryWriter::WriteSectionHeader(const char* desc,
                                      BinarySection section_code) {
  assert(last_section_leb_size_guess_ == 0);
  WriteHeader(desc, PRINT_HEADER_NO_INDEX);
  stream_->WriteU8Enum(section_code, "section code");
  last_section_type_ = section_code;
  last_section_leb_size_guess_ = LEB_SECTION_SIZE_GUESS;
  last_section_offset_ =
      WriteU32Leb128Space(LEB_SECTION_SIZE_GUESS, "section size (guess)");
  last_section_payload_offset_ = stream_->offset();
}